

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O1

uint8_t seek2ch(uint8_t **pos,uint8_t *limit,uint8_t ch)

{
  uint8_t *puVar1;
  bool bVar2;
  
  puVar1 = *pos;
  if ((puVar1 < limit) && (*puVar1 != ch)) {
    puVar1 = (uint8_t *)memchr(puVar1,(uint)ch,(long)limit - (long)puVar1);
    bVar2 = puVar1 != (uint8_t *)0x0;
    if (bVar2) {
      limit = puVar1;
    }
    *pos = limit;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

void __attribute__((format(printf, 1, 0), weak))
FIO_LOG2STDERR(const char *format, ...) {
  char tmp___log[FIO_LOG____LENGTH_ON_STACK];
  va_list argv;
  va_start(argv, format);
  int len___log = vsnprintf(tmp___log, FIO_LOG_LENGTH_LIMIT - 2, format, argv);
  va_end(argv);
  if (len___log <= 0 || len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
    if (len___log >= FIO_LOG_LENGTH_LIMIT - 2) {
      memcpy(tmp___log + FIO_LOG____LENGTH_BORDER, "... (warning: truncated).",
             25);
      len___log = FIO_LOG____LENGTH_BORDER + 25;
    } else {
      fwrite("ERROR: log output error (can't write).\n", 39, 1, stderr);
      return;
    }
  }
  tmp___log[len___log++] = '\n';
  tmp___log[len___log] = '0';
  fwrite(tmp___log, len___log, 1, stderr);
}